

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O3

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::neverReturn(TestMoreStuffImpl *this,NeverReturnContext context)

{
  Disposer *pDVar1;
  ClientHook *pCVar2;
  WirePointer *pWVar3;
  int iVar4;
  long *in_RDX;
  PromiseNode *extraout_RDX;
  bool bVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  Promise<void> PVar10;
  undefined1 local_e8 [8];
  Own<capnp::ClientHook> OStack_e0;
  PointerReader local_c8;
  undefined1 local_a8 [32];
  Promise<void> local_88;
  StructReader local_78;
  StructBuilder local_48;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  kj::_::neverDone();
  local_e8 = (undefined1  [8])local_78.segment;
  OStack_e0.disposer = (Disposer *)local_78.capTable;
  (**(code **)*in_RDX)(local_a8);
  local_48.data = (void *)local_a8._16_8_;
  local_48.pointers = (WirePointer *)local_a8._24_8_;
  local_48.segment = (SegmentBuilder *)local_a8._0_8_;
  local_48.capTable = (CapTableBuilder *)local_a8._8_8_;
  PointerReader::getStruct(&local_78,(PointerReader *)&local_48,(word *)0x0);
  bVar5 = local_78.pointerCount != 0;
  local_48.data = (WirePointer *)0x0;
  if (bVar5) {
    local_48.data = local_78.pointers;
  }
  iVar4 = 0x7fffffff;
  if (bVar5) {
    iVar4 = local_78.nestingLimit;
  }
  uVar6 = 0;
  uVar7 = 0;
  uVar8 = 0;
  uVar9 = 0;
  if (bVar5) {
    uVar6 = local_78.segment._0_4_;
    uVar7 = local_78.segment._4_4_;
    uVar8 = local_78.capTable._0_4_;
    uVar9 = local_78.capTable._4_4_;
  }
  local_48.segment = (SegmentBuilder *)CONCAT44(uVar7,uVar6);
  local_48.capTable = (CapTableBuilder *)CONCAT44(uVar9,uVar8);
  local_48.pointers = (WirePointer *)CONCAT44(local_48.pointers._4_4_,iVar4);
  PointerReader::getCapability((PointerReader *)local_a8);
  local_c8.capTable = (CapTableReader *)local_a8._0_8_;
  local_c8.pointer = (WirePointer *)local_a8._8_8_;
  local_c8.segment = (SegmentReader *)&Capability::Client::typeinfo;
  PVar10 = kj::Promise<void>::attach<capnproto_test::capnp::test::TestInterface::Client>
                     (&local_88,(Client *)local_e8);
  pWVar3 = local_c8.pointer;
  if (local_c8.pointer != (WirePointer *)0x0) {
    local_c8.pointer = (WirePointer *)0x0;
    (*(code *)((SegmentReader *)&(local_c8.capTable)->_vptr_CapTableReader)->arena->_vptr_Arena)
              (local_c8.capTable,
               (long)&(pWVar3->offsetAndKind).value + *(long *)((long)*pWVar3 + -0x10),
               PVar10.super_PromiseBase.node.ptr);
  }
  pDVar1 = OStack_e0.disposer;
  if ((CapTableReader *)OStack_e0.disposer != (CapTableReader *)0x0) {
    OStack_e0.disposer = (Disposer *)0x0;
    (*(code *)(*(Arena **)local_e8)->_vptr_Arena)
              (local_e8,pDVar1->_vptr_Disposer[-2] + (long)&pDVar1->_vptr_Disposer);
  }
  local_c8.segment = (SegmentReader *)((ulong)local_c8.segment & 0xffffffffffffff00);
  (**(code **)(*in_RDX + 0x10))(local_a8);
  local_78.data = (void *)local_a8._16_8_;
  local_78.segment = (SegmentReader *)local_a8._0_8_;
  local_78.capTable = (CapTableReader *)local_a8._8_8_;
  PointerBuilder::getStruct(&local_48,(PointerBuilder *)&local_78,(StructSize)0x10000,(word *)0x0);
  (**(code **)*in_RDX)(&local_c8);
  local_a8._16_8_ = local_c8.pointer;
  local_a8._24_8_ = local_c8._24_8_;
  local_a8._0_8_ = local_c8.segment;
  local_a8._8_8_ = local_c8.capTable;
  PointerReader::getStruct(&local_78,(PointerReader *)local_a8,(word *)0x0);
  bVar5 = local_78.pointerCount != 0;
  local_a8._16_8_ = (WirePointer *)0x0;
  if (bVar5) {
    local_a8._16_8_ = local_78.pointers;
  }
  iVar4 = 0x7fffffff;
  if (bVar5) {
    iVar4 = local_78.nestingLimit;
  }
  local_a8._0_4_ = 0;
  local_a8._4_4_ = 0;
  local_a8._8_4_ = 0;
  local_a8._12_4_ = 0;
  if (bVar5) {
    local_a8._0_4_ = local_78.segment._0_4_;
    local_a8._4_4_ = local_78.segment._4_4_;
    local_a8._8_4_ = local_78.capTable._0_4_;
    local_a8._12_4_ = local_78.capTable._4_4_;
  }
  local_a8._24_4_ = iVar4;
  PointerReader::getCapability(&local_c8);
  OStack_e0.disposer = (Disposer *)local_c8.segment;
  OStack_e0.ptr = (ClientHook *)local_c8.capTable;
  local_e8 = (undefined1  [8])&Capability::Client::typeinfo;
  local_a8._0_8_ = local_48.segment;
  local_a8._8_8_ = local_48.capTable;
  local_a8._16_8_ = local_48.pointers;
  PointerBuilder::setCapability((PointerBuilder *)local_a8,&OStack_e0);
  pCVar2 = OStack_e0.ptr;
  if ((SegmentBuilder *)OStack_e0.ptr != (SegmentBuilder *)0x0) {
    OStack_e0.ptr = (ClientHook *)0x0;
    (*(code *)((SegmentReader *)&(OStack_e0.disposer)->_vptr_Disposer)->arena->_vptr_Arena)
              (OStack_e0.disposer,
               (long)&((SegmentReader *)&pCVar2->_vptr_ClientHook)->arena +
               (long)((SegmentReader *)&pCVar2->_vptr_ClientHook)->arena[-2]._vptr_Arena);
  }
  (**(code **)(*in_RDX + 0x20))();
  *(Disposer **)&this->super_Server = local_88.super_PromiseBase.node.disposer;
  *(PromiseNode **)&(this->super_Server).field_0x8 = local_88.super_PromiseBase.node.ptr;
  PVar10.super_PromiseBase.node.ptr = extraout_RDX;
  PVar10.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar10.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::neverReturn(NeverReturnContext context) {
  ++callCount;

  // Attach `cap` to the promise to make sure it is released.
  auto promise = kj::Promise<void>(kj::NEVER_DONE).attach(context.getParams().getCap());

  // Also attach `cap` to the result struct to make sure that is released.
  context.getResults().setCapCopy(context.getParams().getCap());

  context.allowCancellation();
  return kj::mv(promise);
}